

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2pShaderCompilationCases.cpp
# Opt level: O3

void __thiscall
deqp::gles2::Performance::InvalidShaderCompilerOperCase::~InvalidShaderCompilerOperCase
          (InvalidShaderCompilerOperCase *this)

{
  ~InvalidShaderCompilerOperCase(this);
  operator_delete(this,0xb8);
  return;
}

Assistant:

InvalidShaderCompilerOperCase::~InvalidShaderCompilerOperCase (void)
{
}